

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

PClassActor * __thiscall ADehackedPickup::DetermineType(ADehackedPickup *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  PClassActor *pPVar4;
  spritedef_t *__s2;
  int iVar5;
  int iVar6;
  
  __s2 = sprites.Array + (this->super_AInventory).super_AActor.sprite;
  iVar6 = 0;
  iVar1 = 0x23;
  while( true ) {
    iVar5 = iVar1;
    if (iVar5 < iVar6) {
      return (PClassActor *)0x0;
    }
    iVar2 = (iVar6 + iVar5) / 2;
    iVar3 = memcmp(DehSpriteMappings + iVar2,__s2,4);
    if (iVar3 == 0) break;
    iVar1 = iVar2 + -1;
    if (iVar3 < 0) {
      iVar6 = iVar2 + 1;
      iVar1 = iVar5;
    }
  }
  pPVar4 = PClass::FindActor(DehSpriteMappings[iVar2].ClassName);
  return pPVar4;
}

Assistant:

PClassActor *ADehackedPickup::DetermineType ()
{
	// Look at the actor's current sprite to determine what kind of
	// item to pretend to me.
	int min = 0;
	int max = countof(DehSpriteMappings) - 1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		int lex = memcmp (DehSpriteMappings[mid].Sprite, sprites[sprite].name, 4);
		if (lex == 0)
		{
			return PClass::FindActor(DehSpriteMappings[mid].ClassName);
		}
		else if (lex < 0)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}